

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

Cursor * __thiscall Table::leafNodeFind(Table *this,uint32_t pageNum,uint32_t key)

{
  uint uVar1;
  char *node;
  uint32_t *puVar2;
  Cursor *pCVar3;
  uint32_t cell_num;
  uint32_t uVar4;
  uint32_t uVar5;
  
  node = Pager::getPage(this->pager,pageNum);
  puVar2 = leaf_node_num_cells(node);
  uVar5 = *puVar2;
  pCVar3 = (Cursor *)operator_new(0x18);
  pCVar3->table = this;
  pCVar3->pageNum = pageNum;
  uVar4 = 0;
  do {
    if (uVar5 == uVar4) {
      pCVar3->cellNum = uVar4;
      return pCVar3;
    }
    cell_num = uVar4 + uVar5 >> 1;
    puVar2 = leaf_node_key(node,cell_num);
    uVar1 = *puVar2;
    if (uVar1 == key) {
      pCVar3->cellNum = cell_num;
      cell_num = uVar5;
    }
    else if (uVar1 <= key) {
      uVar4 = cell_num + 1;
      cell_num = uVar5;
    }
    uVar5 = cell_num;
  } while (uVar1 != key);
  return pCVar3;
}

Assistant:

Cursor* Table::leafNodeFind(uint32_t pageNum, uint32_t key) {
	char *node = pager->getPage(pageNum);
	uint32_t numOfCells = *leaf_node_num_cells(node);

	Cursor *c = new Cursor;
	c->table = this;
	c->pageNum = pageNum;

	//Binary search
	uint32_t minIndex = 0;
	uint32_t onePastMaxIndex = numOfCells;
	while (onePastMaxIndex != minIndex) {
		uint32_t index = (onePastMaxIndex + minIndex) / 2;
		uint32_t keyAtIndex = *(leaf_node_key(node, index));
		if (key == keyAtIndex) {
			c->cellNum = index;
			return c;
		}
		if (key < keyAtIndex) {
			onePastMaxIndex = index;
		} else {
			minIndex = index + 1;
		}
	}

	c->cellNum = minIndex;
	return c;
}